

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Max_f64(w3Interp *this)

{
  double *__a;
  double *pdVar1;
  double *z1;
  double z2;
  w3Interp *this_local;
  
  z2 = (double)this;
  z1 = (double *)w3Stack::pop_f64(&this->super_w3Stack);
  __a = w3Stack::f64(&this->super_w3Stack);
  pdVar1 = std::max<double>(__a,(double *)&z1);
  *__a = *pdVar1;
  return;
}

Assistant:

INTERP (Max_f64)
{
    const double z2 = pop_f64 ();
    double& z1 = f64 ();
    z1 = std::max (z1, z2);
}